

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall
Js::DebuggerScope::AreAllPropertiesInDeadZone(DebuggerScope *this,int byteCodeOffset)

{
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  pLVar1 = (this->scopeProperties).ptr;
  if ((pLVar1 == (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)0x0) ||
     ((pLVar1->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
      count < 1)) {
    bVar6 = false;
  }
  else {
    lVar5 = -1;
    lVar4 = 0;
    do {
      lVar3 = (long)(pLVar1->
                    super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>
                    ).count;
      lVar5 = lVar5 + 1;
      bVar6 = lVar3 <= lVar5;
      if (lVar3 <= lVar5) {
        return bVar6;
      }
      bVar2 = DebuggerScopeProperty::IsInDeadZone
                        ((DebuggerScopeProperty *)
                         ((long)&((pLVar1->
                                  super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>
                                  ).buffer.ptr)->propId + lVar4),byteCodeOffset);
      lVar4 = lVar4 + 0x10;
    } while (bVar2);
  }
  return bVar6;
}

Assistant:

bool DebuggerScope::AreAllPropertiesInDeadZone(int byteCodeOffset) const
    {
        if (!this->HasProperties())
        {
            return false;
        }

        return this->scopeProperties->All([&](Js::DebuggerScopeProperty& propertyItem)
            {
                return propertyItem.IsInDeadZone(byteCodeOffset);
            });
    }